

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cancellation_signal.hpp
# Opt level: O0

op_cancellation<asio::experimental::channel_traits<>,_void_(std::error_code,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
* __thiscall
asio::cancellation_slot::
emplace<asio::experimental::detail::channel_service<asio::detail::null_mutex>::op_cancellation<asio::experimental::channel_traits<>,void(std::error_code,std::__cxx11::string)>,asio::experimental::detail::channel_service<asio::detail::null_mutex>*,asio::experimental::detail::channel_service<asio::detail::null_mutex>::implementation_type<asio::experimental::channel_traits<>,void(std::error_code,std::__cxx11::string)>*>
          (cancellation_slot *this,channel_service<asio::detail::null_mutex> **args,
          implementation_type<asio::experimental::channel_traits<>,_void_(std::error_code,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
          **args_1)

{
  op_cancellation<asio::experimental::channel_traits<>,_void_(std::error_code,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
  *poVar1;
  undefined8 *in_RDI;
  pair<void_*,_unsigned_long> pVar2;
  cancellation_handler_type *handler_obj;
  auto_delete_helper del;
  auto_delete_helper *in_stack_ffffffffffffffc0;
  size_t in_stack_ffffffffffffffc8;
  cancellation_handler<asio::experimental::detail::channel_service<asio::detail::null_mutex>::op_cancellation<asio::experimental::channel_traits<>,_void_(std::error_code,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>_>
  *in_stack_ffffffffffffffd0;
  undefined8 local_28;
  
  pVar2 = prepare_memory((cancellation_slot *)in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,
                         (size_t)in_stack_ffffffffffffffc0);
  local_28 = (cancellation_handler<asio::experimental::detail::channel_service<asio::detail::null_mutex>::op_cancellation<asio::experimental::channel_traits<>,_void_(std::error_code,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>_>
              *)pVar2.first;
  asio::detail::
  cancellation_handler<asio::experimental::detail::channel_service<asio::detail::null_mutex>::op_cancellation<asio::experimental::channel_traits<>,void(std::error_code,std::__cxx11::string)>>
  ::
  cancellation_handler<asio::experimental::detail::channel_service<asio::detail::null_mutex>*,asio::experimental::detail::channel_service<asio::detail::null_mutex>::implementation_type<asio::experimental::channel_traits<>,void(std::error_code,std::__cxx11::string)>*>
            (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,
             (channel_service<asio::detail::null_mutex> **)in_stack_ffffffffffffffc0,
             (implementation_type<asio::experimental::channel_traits<>,_void_(std::error_code,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
              **)local_28);
  *(cancellation_handler<asio::experimental::detail::channel_service<asio::detail::null_mutex>::op_cancellation<asio::experimental::channel_traits<>,_void_(std::error_code,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>_>
    **)*in_RDI = local_28;
  poVar1 = asio::detail::
           cancellation_handler<asio::experimental::detail::channel_service<asio::detail::null_mutex>::op_cancellation<asio::experimental::channel_traits<>,_void_(std::error_code,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>_>
           ::handler(local_28);
  auto_delete_helper::~auto_delete_helper(in_stack_ffffffffffffffc0);
  return poVar1;
}

Assistant:

CancellationHandler& emplace(ASIO_MOVE_ARG(Args)... args)
  {
    typedef detail::cancellation_handler<CancellationHandler>
      cancellation_handler_type;
    auto_delete_helper del = { prepare_memory(
        sizeof(cancellation_handler_type),
        ASIO_ALIGNOF(CancellationHandler)) };
    cancellation_handler_type* handler_obj =
      new (del.mem.first) cancellation_handler_type(
        del.mem.second, ASIO_MOVE_CAST(Args)(args)...);
    del.mem.first = 0;
    *handler_ = handler_obj;
    return handler_obj->handler();
  }